

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_mustache.cpp
# Opt level: O0

void __thiscall TestMustache::testFloatValues(TestMustache *this)

{
  initializer_list<float> args;
  bool bVar1;
  iterator o;
  float *pfVar2;
  QVariant *this_00;
  undefined1 local_228 [8];
  QString output;
  undefined1 local_1f0 [8];
  QtVariantContext context;
  Renderer renderer;
  undefined1 local_100 [8];
  QString expectedOutput;
  QString _template;
  QVariant local_b8;
  QHash<QString,_QVariant> local_98;
  QVariantHash map;
  float value;
  iterator __end1;
  iterator local_68;
  iterator __begin1;
  QList<float> *__range1;
  undefined4 uStack_50;
  undefined4 local_4c;
  undefined4 uStack_48;
  undefined8 uStack_44;
  QList<float> **local_38;
  undefined8 local_30;
  undefined1 local_28 [8];
  QList<float> values;
  TestMustache *this_local;
  
  uStack_48 = 0x3f800000;
  uStack_44 = 0x404000003fc00000;
  __range1 = (QList<float> *)0xbf000000c0400000;
  uStack_50 = 0;
  local_4c = 0x3f000000;
  local_38 = &__range1;
  local_30 = 7;
  args._M_len = 7;
  args._M_array = (iterator)local_38;
  values.d.size = (qsizetype)this;
  QList<float>::QList((QList<float> *)local_28,args);
  __begin1.i = (float *)local_28;
  local_68 = QList<float>::begin((QList<float> *)local_28);
  o = QList<float>::end(__begin1.i);
  while (bVar1 = QList<float>::iterator::operator!=(&local_68,o), bVar1) {
    pfVar2 = QList<float>::iterator::operator*(&local_68);
    map.d._4_4_ = *pfVar2;
    QHash<QString,_QVariant>::QHash(&local_98);
    ::QVariant::QVariant(&local_b8,map.d._4_4_);
    QString::QString((QString *)&_template.d.size,"val");
    this_00 = QHash<QString,_QVariant>::operator[](&local_98,(QString *)&_template.d.size);
    ::QVariant::operator=(this_00,&local_b8);
    QString::~QString((QString *)&_template.d.size);
    ::QVariant::~QVariant(&local_b8);
    QString::QString((QString *)&expectedOutput.d.size,"Value: {{val}}");
    QString::number((double)map.d._4_4_,(char)&renderer + -0x58,0x67);
    operator+((QString *)local_100,"Value: ",(QString *)&renderer.m_defaultTagEndMarker.d.size);
    QString::~QString((QString *)&renderer.m_defaultTagEndMarker.d.size);
    Mustache::Renderer::Renderer((Renderer *)&context.m_contextStack.super_QList<QVariant>.d.size);
    ::QVariant::QVariant((QVariant *)&output.d.size,(QHash_conflict *)&local_98);
    Mustache::QtVariantContext::QtVariantContext
              ((QtVariantContext *)local_1f0,(QVariant *)&output.d.size,(PartialResolver *)0x0);
    ::QVariant::~QVariant((QVariant *)&output.d.size);
    Mustache::Renderer::render
              ((QString *)local_228,(Renderer *)&context.m_contextStack.super_QList<QVariant>.d.size
               ,(QString *)&expectedOutput.d.size,(Context *)local_1f0);
    bVar1 = QTest::qCompare((QString *)local_228,(QString *)local_100,"output","expectedOutput",
                            "/workspace/llm4binary/github/license_c_cmakelists/robertknight[P]qt-mustache/tests/test_mustache.cpp"
                            ,0x48);
    QString::~QString((QString *)local_228);
    Mustache::QtVariantContext::~QtVariantContext((QtVariantContext *)local_1f0);
    Mustache::Renderer::~Renderer((Renderer *)&context.m_contextStack.super_QList<QVariant>.d.size);
    QString::~QString((QString *)local_100);
    QString::~QString((QString *)&expectedOutput.d.size);
    QHash<QString,_QVariant>::~QHash(&local_98);
    if (!bVar1) break;
    QList<float>::iterator::operator++(&local_68);
  }
  QList<float>::~QList((QList<float> *)local_28);
  return;
}

Assistant:

void TestMustache::testFloatValues()
{
  QList<float> values = {-3., -0.5, 0., 0.5, 1., 1.5, 3.};

  for (auto value : values) {
    QVariantHash map;
    map["val"] = value;
    QString _template = "Value: {{val}}";
    QString expectedOutput = "Value: " + QString::number(value);

    Mustache::Renderer renderer;
    Mustache::QtVariantContext context(map);
    QString output = renderer.render(_template, &context);

    QCOMPARE(output, expectedOutput);
  }
}